

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

void __thiscall Vault::KeyValue::KeyValue(KeyValue *this,Client *client,SecretMount *mount)

{
  this->client_ = client;
  this->version_ = v2;
  std::__cxx11::string::string((string *)&this->mount_,(string *)mount);
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client, Vault::SecretMount mount)
    : client_(client)
    , version_(KeyValue::Version::v2)
    , mount_(std::move(mount)) {}